

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelBufferDataSizeCase::init
          (TextureLevelBufferDataSizeCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  ContextType ctxType;
  int iVar2;
  NotSupportedError *this_00;
  char *ctx_00;
  string local_40;
  
  ctx_00 = "GL_EXT_texture_buffer";
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TextureLevelCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_EXT_texture_buffer");
  if (!bVar1) {
    ctxType.super_ApiType.m_bits =
         (ApiType)(*((this->super_TextureLevelCase).super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[2])();
    ctx_00 = (char *)0x23;
    bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
    if (!bVar1) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Test requires GL_EXT_texture_buffer extension","");
      tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar2 = TextureLevelCase::init(&this->super_TextureLevelCase,(EVP_PKEY_CTX *)ctx_00);
  return iVar2;
}

Assistant:

void init (void)
	{
		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_buffer") &&
			!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2)))
			throw tcu::NotSupportedError("Test requires GL_EXT_texture_buffer extension");
		TextureLevelCase::init();
	}